

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
* testing::internal::edit_distance::CalculateOptimalEdits
            (vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             *__return_storage_ptr__,vector<unsigned_long,_std::allocator<unsigned_long>_> *left,
            vector<unsigned_long,_std::allocator<unsigned_long>_> *right)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined4 uVar4;
  pointer puVar5;
  pointer puVar6;
  pointer pdVar7;
  pointer pEVar8;
  pointer pvVar9;
  pointer pdVar10;
  pointer pdVar11;
  iterator __position;
  undefined4 *puVar12;
  void *p;
  undefined4 *puVar13;
  long lVar14;
  long lVar15;
  undefined4 *puVar16;
  ulong uVar17;
  vector<testing::internal::edit_distance::EditType,std::allocator<testing::internal::edit_distance::EditType>>
  *this;
  EditType EVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 local_98 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  costs;
  undefined1 local_70 [8];
  EditType move;
  pointer local_60;
  vector<testing::internal::edit_distance::EditType,std::allocator<testing::internal::edit_distance::EditType>>
  *local_58;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  *best_path;
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  best_move;
  
  puVar5 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_58 = (vector<testing::internal::edit_distance::EditType,std::allocator<testing::internal::edit_distance::EditType>>
              *)__return_storage_ptr__;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&best_path,
             ((long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) + 1,(allocator_type *)local_70);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_98,((long)puVar6 - (long)puVar5 >> 3) + 1,(value_type *)&best_path,
           (allocator_type *)
           ((long)&best_move.
                   super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  if (best_path !=
      (vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
       *)0x0) {
    operator_delete(best_path,
                    (long)best_move.
                          super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)best_path);
  }
  puVar5 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  std::
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ::vector((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
            *)local_70,
           ((long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_start >> 3) + 1,
           (allocator_type *)
           ((long)&best_move.
                   super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  ::vector((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
            *)&best_path,((long)puVar6 - (long)puVar5 >> 3) + 1,(value_type *)local_70,
           (allocator_type *)
           ((long)&best_move.
                   super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  this = local_58;
  p = (void *)CONCAT44(local_70._4_4_,local_70._0_4_);
  if (p != (void *)0x0) {
    operator_delete(p,(long)local_60 - (long)p);
  }
  if ((long)costs.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start - (long)local_98 != 0) {
    lVar14 = ((long)costs.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)local_98 >> 3) *
             -0x5555555555555555;
    lVar19 = 0;
    lVar20 = 0;
    do {
      auVar22._8_4_ = (int)((ulong)lVar20 >> 0x20);
      auVar22._0_8_ = lVar20;
      auVar22._12_4_ = 0x45300000;
      **(double **)
        ((long)&(((_Vector_base<double,_std::allocator<double>_> *)local_98)->_M_impl).
                super__Vector_impl_data._M_start + lVar19) =
           (auVar22._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0);
      **(undefined4 **)
        ((long)&(best_path->
                super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                )._M_impl.super__Vector_impl_data._M_start + lVar19) = 2;
      lVar20 = lVar20 + 1;
      lVar19 = lVar19 + 0x18;
    } while (lVar14 + (ulong)(lVar14 == 0) != lVar20);
  }
  pdVar7 = (((_Vector_base<double,_std::allocator<double>_> *)local_98)->_M_impl).
           super__Vector_impl_data._M_start;
  uVar17 = (long)(((_Vector_base<double,_std::allocator<double>_> *)local_98)->_M_impl).
                 super__Vector_impl_data._M_finish - (long)pdVar7 >> 3;
  if (1 < uVar17) {
    pEVar8 = (best_path->
             super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar21 = 1;
    do {
      auVar23._8_4_ = (int)(uVar21 >> 0x20);
      auVar23._0_8_ = uVar21;
      auVar23._12_4_ = 0x45300000;
      pdVar7[uVar21] =
           (auVar23._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar21) - 4503599627370496.0);
      pEVar8[uVar21] = kAdd;
      uVar21 = uVar21 + 1;
    } while (uVar17 != uVar21);
  }
  pvVar9 = (pointer)(left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start;
  costs.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish;
  lVar14 = (long)costs.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar9 >> 3;
  puVar5 = (right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (costs.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != pvVar9) {
    lVar19 = (long)puVar6 - (long)puVar5 >> 3;
    lVar20 = 0;
    do {
      if (puVar6 != puVar5) {
        pdVar7 = (&(pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start)[lVar20];
        pEVar8 = best_path[lVar20 + 1].
                 super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar15 = 0;
        do {
          if (pdVar7 == (pointer)puVar5[lVar15]) {
            (((pointer)((long)local_98 + (lVar20 + 1) * 0x18))->
            super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
            _M_start[lVar15 + 1] =
                 (((pointer)((long)local_98 + lVar20 * 0x18))->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar15];
            EVar18 = kMatch;
          }
          else {
            pdVar10 = (((pointer)((long)local_98 + (lVar20 + 1) * 0x18))->
                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            dVar1 = pdVar10[lVar15];
            pdVar11 = (((pointer)((long)local_98 + lVar20 * 0x18))->
                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            dVar2 = pdVar11[lVar15];
            dVar3 = pdVar11[lVar15 + 1];
            if ((dVar3 <= dVar1) || (dVar2 <= dVar1)) {
              if ((dVar1 <= dVar3) || (dVar2 <= dVar3)) {
                pdVar10[lVar15 + 1] = dVar2 + 1.00001;
                EVar18 = kReplace;
              }
              else {
                pdVar10[lVar15 + 1] = dVar3 + 1.0;
                EVar18 = kRemove;
              }
            }
            else {
              pdVar10[lVar15 + 1] = dVar1 + 1.0;
              EVar18 = kAdd;
            }
          }
          pEVar8[lVar15 + 1] = EVar18;
          lVar15 = lVar15 + 1;
          this = local_58;
        } while (lVar19 + (ulong)(lVar19 == 0) != lVar15);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != lVar14 + (ulong)(lVar14 == 0));
  }
  *(undefined1 (*) [16])this = (undefined1  [16])0x0;
  *(undefined8 *)(this + 0x10) = 0;
  if (puVar6 != puVar5 ||
      costs.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != pvVar9) {
    lVar19 = (long)puVar6 - (long)puVar5 >> 3;
    do {
      local_70._0_4_ =
           best_path[lVar14].
           super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar19];
      __position._M_current = *(EditType **)(this + 8);
      if (__position._M_current == *(EditType **)(this + 0x10)) {
        std::
        vector<testing::internal::edit_distance::EditType,std::allocator<testing::internal::edit_distance::EditType>>
        ::_M_realloc_insert<testing::internal::edit_distance::EditType_const&>
                  (this,__position,(EditType *)local_70);
      }
      else {
        *__position._M_current = local_70._0_4_;
        *(EditType **)(this + 8) = __position._M_current + 1;
      }
      lVar14 = lVar14 - (ulong)(local_70._0_4_ != kAdd);
      lVar19 = lVar19 - (ulong)(local_70._0_4_ != kRemove);
    } while (lVar14 != 0 || lVar19 != 0);
    puVar12 = *(undefined4 **)this;
    puVar16 = *(undefined4 **)(this + 8) + -1;
    if (puVar12 < puVar16 && puVar12 != *(undefined4 **)(this + 8)) {
      do {
        puVar13 = puVar12 + 1;
        uVar4 = *puVar12;
        *puVar12 = *puVar16;
        *puVar16 = uVar4;
        puVar16 = puVar16 + -1;
        puVar12 = puVar13;
      } while (puVar13 < puVar16);
    }
  }
  std::
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  ::~vector((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
             *)&best_path);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_98);
  return (vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
          *)this;
}

Assistant:

std::vector<EditType> CalculateOptimalEdits(const std::vector<size_t>& left,
                                            const std::vector<size_t>& right) {
  std::vector<std::vector<double> > costs(
      left.size() + 1, std::vector<double>(right.size() + 1));
  std::vector<std::vector<EditType> > best_move(
      left.size() + 1, std::vector<EditType>(right.size() + 1));

  // Populate for empty right.
  for (size_t l_i = 0; l_i < costs.size(); ++l_i) {
    costs[l_i][0] = static_cast<double>(l_i);
    best_move[l_i][0] = kRemove;
  }
  // Populate for empty left.
  for (size_t r_i = 1; r_i < costs[0].size(); ++r_i) {
    costs[0][r_i] = static_cast<double>(r_i);
    best_move[0][r_i] = kAdd;
  }

  for (size_t l_i = 0; l_i < left.size(); ++l_i) {
    for (size_t r_i = 0; r_i < right.size(); ++r_i) {
      if (left[l_i] == right[r_i]) {
        // Found a match. Consume it.
        costs[l_i + 1][r_i + 1] = costs[l_i][r_i];
        best_move[l_i + 1][r_i + 1] = kMatch;
        continue;
      }

      const double add = costs[l_i + 1][r_i];
      const double remove = costs[l_i][r_i + 1];
      const double replace = costs[l_i][r_i];
      if (add < remove && add < replace) {
        costs[l_i + 1][r_i + 1] = add + 1;
        best_move[l_i + 1][r_i + 1] = kAdd;
      } else if (remove < add && remove < replace) {
        costs[l_i + 1][r_i + 1] = remove + 1;
        best_move[l_i + 1][r_i + 1] = kRemove;
      } else {
        // We make replace a little more expensive than add/remove to lower
        // their priority.
        costs[l_i + 1][r_i + 1] = replace + 1.00001;
        best_move[l_i + 1][r_i + 1] = kReplace;
      }
    }
  }

  // Reconstruct the best path. We do it in reverse order.
  std::vector<EditType> best_path;
  for (size_t l_i = left.size(), r_i = right.size(); l_i > 0 || r_i > 0;) {
    EditType move = best_move[l_i][r_i];
    best_path.push_back(move);
    l_i -= move != kAdd;
    r_i -= move != kRemove;
  }
  std::reverse(best_path.begin(), best_path.end());
  return best_path;
}